

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O3

void __thiscall
cp::PlanFootprints::init_setup
          (PlanFootprints *this,Affine3d *init_leg_pose,Quat *waist_q,Vector3 *com,double *endcpoff)

{
  double *pdVar1;
  PlanFootprints *pPVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  long lVar9;
  PlanFootprints *pPVar10;
  bool bVar11;
  Scalar *dst_ptr;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar12;
  long lVar13;
  long lVar14;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  char *__function;
  PlanFootprints *pPVar15;
  bool bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  PlanFootprints *pPVar20;
  PlanFootprints *pPVar21;
  LinearMatrixType result;
  Vector3 trans;
  double adStack_150 [8];
  undefined1 local_110 [32];
  double local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  double *local_a8;
  Quat *local_a0;
  Vector3 *local_98;
  PlanFootprints *local_90;
  PlanFootprints *local_88;
  PlanFootprints *local_80;
  PlanFootprints *local_78;
  Affine3d *local_70;
  Scalar local_68;
  double adStack_60 [4];
  double dStack_40;
  
  pPVar20 = this + 0x310;
  pPVar21 = this + 0x10;
  pPVar15 = this + 0x4d8;
  lVar14 = 0;
  local_a8 = endcpoff;
  local_a0 = waist_q;
  local_98 = com;
  local_90 = this;
  local_88 = pPVar15;
  local_80 = pPVar21;
  local_78 = pPVar20;
  local_70 = init_leg_pose;
  bVar11 = true;
  do {
    bVar16 = bVar11;
    if (((ulong)init_leg_pose & 0xf) != 0) {
      __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                    "Eigen::internal::block_evaluator<const Eigen::Matrix<double, 4, 4>, 3, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<double, 4, 4>, BlockRows = 3, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
                   );
    }
    pdVar1 = init_leg_pose[lVar14].m_matrix.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
             0xc;
    local_68 = *pdVar1;
    adStack_60[0] = pdVar1[1];
    dVar3 = init_leg_pose[lVar14].m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
    ;
    adStack_60[1] = dVar3;
    adStack_60[3] = local_68;
    dStack_40 = adStack_60[0];
    Eigen::Transform<double,3,2,0>::
    computeRotationScaling<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
              ((Transform<double,3,2,0> *)(init_leg_pose + lVar14),
               (Matrix<double,_3,_3,_0,_3,_3> *)local_110,(Matrix<double,_3,_3,_0,_3,_3> *)0x0);
    dVar4 = local_f0 + local_d8[1] + (double)local_110._0_8_;
    if (dVar4 <= 0.0) {
      uVar18 = (ulong)((double)local_110._0_8_ < local_f0);
      pMVar12 = (Matrix<double,_3,_3,_0,_3,_3> *)local_110;
      if ((double)local_110._0_8_ < local_f0) {
        pMVar12 = (Matrix<double,_3,_3,_0,_3,_3> *)(local_110 + 0x18);
      }
      pdVar1 = (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array + uVar18;
      if (*pdVar1 <= local_d8[1] && local_d8[1] != *pdVar1) {
        uVar18 = 2;
      }
      lVar13 = 0;
      if (uVar18 + 1 != 3) {
        lVar13 = uVar18 + 1;
      }
      uVar17 = lVar13 - 2;
      if (lVar13 + 1U < 3) {
        uVar17 = lVar13 + 1U;
      }
      lVar9 = lVar13 * 0x18 + -0x110;
      dVar4 = ((*(double *)(local_110 + uVar18 * 0x20) -
               *(double *)(local_110 + lVar13 * 8 + lVar9 + 0x110)) -
              *(double *)(local_110 + uVar17 * 0x20)) + 1.0;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar5 = 0.5 / dVar4;
      uVar19 = (ulong)(uint)((int)uVar18 << 3);
      *(double *)(local_c8 + uVar19) = dVar4 * 0.5;
      local_b8._8_8_ =
           (*(double *)(local_110 + uVar17 * 8 + lVar9 + 0x110) -
           *(double *)(local_110 + lVar13 * 8 + uVar17 * 0x18)) * dVar5;
      *(double *)(local_c8 + lVar13 * 8) =
           (*(double *)(local_110 + lVar13 * 8 + uVar18 * 0x18) +
           *(double *)(local_110 + uVar19 + lVar9 + 0x110)) * dVar5;
      *(double *)(local_c8 + uVar17 * 8) =
           (*(double *)(local_110 + uVar17 * 8 + uVar18 * 0x18) +
           *(double *)(local_110 + uVar19 + uVar17 * 0x18)) * dVar5;
      init_leg_pose = local_70;
      pPVar15 = local_88;
      pPVar20 = local_78;
      pPVar21 = local_80;
    }
    else {
      dVar4 = dVar4 + 1.0;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar5 = 0.5 / dVar4;
      dVar6 = dVar5 * (dStack_e0 - (double)local_110._16_8_);
      local_c8._8_4_ = SUB84(dVar6,0);
      local_c8._0_8_ = dVar5 * (local_e8 - local_d8[0]);
      local_c8._12_4_ = (int)((ulong)dVar6 >> 0x20);
      local_b8._8_4_ = SUB84(dVar4 * 0.5,0);
      local_b8._0_8_ = dVar5 * ((double)local_110._8_8_ - (double)local_110._24_8_);
      local_b8._12_4_ = (int)((ulong)(dVar4 * 0.5) >> 0x20);
    }
    pPVar10 = local_90;
    lVar13 = lVar14 * 0xe0;
    *(double *)(pPVar20 + lVar13) = adStack_60[3];
    *(double *)(pPVar20 + lVar13 + 8) = dStack_40;
    *(double *)(pPVar20 + lVar13 + 0x10) = dVar3;
    *(undefined8 *)(pPVar20 + lVar13 + 0x20) = local_c8._0_8_;
    *(undefined8 *)(pPVar20 + lVar13 + 0x20 + 8) = local_c8._8_8_;
    *(undefined8 *)(pPVar20 + lVar13 + 0x30) = local_b8._0_8_;
    *(undefined8 *)(pPVar20 + lVar13 + 0x30 + 8) = local_b8._8_8_;
    *(double *)(pPVar21 + lVar13) = adStack_60[3];
    *(double *)(pPVar21 + lVar13 + 8) = dStack_40;
    *(double *)(pPVar21 + lVar13 + 0x10) = dVar3;
    *(undefined8 *)(pPVar21 + lVar13 + 0x20) = local_c8._0_8_;
    *(undefined8 *)(pPVar21 + lVar13 + 0x20 + 8) = local_c8._8_8_;
    *(undefined8 *)(pPVar21 + lVar13 + 0x30) = local_b8._0_8_;
    *(undefined8 *)(pPVar21 + lVar13 + 0x30 + 8) = local_b8._8_8_;
    pPVar2 = pPVar15 + lVar14 * 0x18;
    if (((ulong)pPVar2 >> 3 & 1) == 0) {
      *(double *)pPVar2 = adStack_60[3];
      *(double *)(pPVar2 + 8) = dStack_40;
      *(double *)(pPVar2 + 0x10) = dVar3;
    }
    else {
      *(double *)pPVar2 = adStack_60[3];
      uVar18 = (ulong)(((uint)((ulong)pPVar2 >> 3) & 1) << 3);
      uVar7 = *(undefined8 *)((long)adStack_60 + uVar18);
      *(undefined8 *)(pPVar2 + uVar18) = *(undefined8 *)((long)&local_68 + uVar18);
      *(undefined8 *)(pPVar2 + uVar18 + 8) = uVar7;
    }
    lVar14 = 1;
    bVar11 = false;
  } while (bVar16);
  dVar3 = (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  *(double *)(local_90 + 0x1d0) =
       (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  *(double *)(local_90 + 0x1d8) = dVar3;
  *(double *)(local_90 + 0x1e0) =
       (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar3 = (local_a0->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1];
  *(double *)(local_90 + 0x1f0) =
       (local_a0->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  *(double *)(local_90 + 0x1f8) = dVar3;
  dVar3 = (local_a0->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[3];
  *(double *)(local_90 + 0x200) =
       (local_a0->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[2];
  *(double *)(local_90 + 0x208) = dVar3;
  local_110._0_8_ = local_90 + 0x2d0;
  local_110._8_8_ = 0.0;
  local_110._16_8_ = 4.94065645841247e-324;
  local_110._24_8_ = 4.94065645841247e-324;
  *(double *)(local_90 + 0x2d0) =
       (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_110,
             (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array + 1);
  if ((local_110._24_8_ + local_110._8_8_ == 2) &&
     ((double)local_110._16_8_ == 4.94065645841247e-324)) {
    *(double *)(pPVar10 + 0x508) = *local_a8;
    *(double *)(pPVar10 + 0x510) = local_a8[1];
    local_110._0_8_ = pPVar10 + 0x2e8;
    local_110._8_8_ = 0.0;
    local_110._16_8_ = 4.94065645841247e-324;
    local_110._24_8_ = 4.94065645841247e-324;
    *(undefined8 *)(pPVar10 + 0x2e8) = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_c8._8_8_;
    local_c8 = auVar8 << 0x40;
    this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_110,
                         (Scalar *)local_c8);
    local_68 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this_00,&local_68);
    if ((local_110._24_8_ + local_110._8_8_ == 3) &&
       ((double)local_110._16_8_ == 4.94065645841247e-324)) {
      *(undefined8 *)(pPVar10 + 0x300) = 0;
      *(undefined4 *)(pPVar10 + 0x4d0) = 0;
      return;
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
    ;
  }
  else {
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

void PlanFootprints::init_setup(const Affine3d init_leg_pose[],
                                const Quat& waist_q, const Vector3& com,
                                const double endcpoff[]) {
  for (int i = 0; i < 2; ++i) {
    Vector3 trans = init_leg_pose[i].translation();
    Quat q(init_leg_pose[i].rotation());
    init_feet_pose[i].set(trans, q);
    ref_land_pose[i].set(init_feet_pose[i]);
    dist_body2foot[i] << trans;  // TODO! subtraction to body position
  }
  ref_waist_pose.set(com, waist_q);
  // ref_waist_r = waist_r;
  end_cp << com[0], com[1];
  end_cp_offset[0] = endcpoff[0];  end_cp_offset[1] = endcpoff[1];
  step_vector << 0.0, 0.0, 0.0;
  step_angle = 0.0;
  step_num = 0;
}